

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

int main(void)

{
  int iVar1;
  CMUnitTest tests [8];
  
  memcpy(tests,&PTR_anon_var_dwarf_2b_0011ec90,0x140);
  iVar1 = _cmocka_run_group_tests("tests",tests,8,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(mini_fuzz_array_container_intersection_inplace),
        cmocka_unit_test(
            mini_fuzz_recycle_array_container_intersection_inplace),
        cmocka_unit_test(printf_test),
        cmocka_unit_test(add_contains_test),
        cmocka_unit_test(and_or_test),
        cmocka_unit_test(to_uint32_array_test),
        cmocka_unit_test(select_test),
        cmocka_unit_test(capacity_test)};

    return cmocka_run_group_tests(tests, NULL, NULL);
}